

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_8(QPDF *pdf,char *arg2)

{
  char cVar1;
  Provider *this;
  ostream *poVar2;
  logic_error *this_00;
  allocator<char> local_139;
  QPDFObjectHandle qstream;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120 [3];
  undefined1 local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  string local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_e8;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  shared_ptr<Buffer> b;
  QPDFObjectHandle root;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_a8;
  Pl_Buffer p1;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Pl_Flate p2;
  
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p1,"/QStream",(allocator<char> *)&p2);
  QPDFObjectHandle::getKey((string *)&qstream);
  std::__cxx11::string::~string((string *)&p1);
  cVar1 = QPDFObjectHandle::isStream();
  if (cVar1 != '\0') {
    Pl_Buffer::Pl_Buffer(&p1,"buffer",(Pipeline *)0x0);
    Pl_Flate::Pl_Flate(&p2,"compress",(Pipeline *)&p1,a_deflate,0x10000);
    Pipeline::operator<<((Pipeline *)&p2,"new data for stream\n");
    Pl_Flate::finish();
    Pl_Buffer::getBufferSharedPointer();
    this = (Provider *)operator_new(0x28);
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
    Provider::Provider(this,(shared_ptr<Buffer> *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Provider,void>
              ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)&p,
               this);
    std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_e8,
                 &p.
                  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                );
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/FlateDecode",&local_139);
    QPDFObjectHandle::newName(local_f8);
    QPDFObjectHandle::newNull();
    QPDFObjectHandle::replaceStreamData(&qstream,&local_e8,local_f8,local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
    this->bad_length = false;
    QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::setLinearization(SUB81(&w,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
    QPDFWriter::write();
    this->bad_length = true;
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    poVar2 = std::operator<<((ostream *)&std::cout,"oops -- getStreamData didn\'t throw");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Pl_Flate::~Pl_Flate(&p2);
    Pl_Buffer::~Pl_Buffer(&p1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&qstream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"test 7 run on file with no QStream");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
test_8(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle qstream = root.getKey("/QStream");
    if (!qstream.isStream()) {
        throw std::logic_error("test 7 run on file with no QStream");
    }
    Pl_Buffer p1("buffer");
    Pl_Flate p2("compress", &p1, Pl_Flate::a_deflate);
    p2 << "new data for stream\n";
    p2.finish();
    auto b = p1.getBufferSharedPointer();
    // This is a bogus way to use StreamDataProvider, but it does
    // adequately test its functionality.
    auto* provider = new Provider(b);
    auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(provider);
    qstream.replaceStreamData(
        p, QPDFObjectHandle::newName("/FlateDecode"), QPDFObjectHandle::newNull());
    provider->badLength(false);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    // Linearize to force the provider to be called multiple times.
    w.setLinearization(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();

    // Every time a provider pipes stream data, it has to provide
    // the same amount of data.
    provider->badLength(true);
    try {
        qstream.getStreamData();
        std::cout << "oops -- getStreamData didn't throw" << std::endl;
    } catch (std::exception const& e) {
        std::cout << "exception: " << e.what() << std::endl;
    }
}